

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_lineorder(exr_context_t ctxt,int part_index,char *name,exr_lineorder_t lval)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  int iVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_attribute_list_t *list;
  exr_result_t eStackY_50;
  undefined8 in_stack_ffffffffffffffb8;
  exr_attribute_t *attr;
  
  if (EXR_LINEORDER_RANDOM_Y < lval) {
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"\'%s\' value for line order enum (%d) out of range (%d - %d)",name,
                       (ulong)lval,0,CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),3));
    return eVar1;
  }
  if ((name != (char *)0x0) && (iVar2 = strcmp(name,"lineOrder"), iVar2 == 0)) {
    eVar1 = exr_set_lineorder(ctxt,part_index,lval);
    return eVar1;
  }
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 0x15;
LAB_0011b810:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_50);
    return eVar1;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 8;
    goto LAB_0011b810;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar1 == 0) {
    if (attr->type != EXR_ATTR_LINEORDER) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'uc\', but stored attributes is type \'%s\'",name,
                         attr->type_name);
      return eVar1;
    }
  }
  else {
    if (eVar1 != 0xf) goto LAB_0011b8a2;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&attr);
    if (eVar1 != 0) goto LAB_0011b8a2;
  }
  (attr->field_6).uc = (uint8_t)lval;
  eVar1 = 0;
LAB_0011b8a2:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_lineorder (
    exr_context_t ctxt, int part_index, const char* name, exr_lineorder_t lval)
{
    uint8_t val = (uint8_t) lval;
    if (lval >= EXR_LINEORDER_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'%s' value for line order enum (%d) out of range (%d - %d)",
            name,
            (int) lval,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    if (name && 0 == strcmp (name, EXR_REQ_LO_STR))
        return exr_set_lineorder (ctxt, part_index, val);

    {
        ATTR_SET_IMPL (EXR_ATTR_LINEORDER, uc);
    }
}